

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::render(Plotter *this,View *view)

{
  Environment *this_00;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *this_01;
  Expr *pEVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  pointer pPVar6;
  pointer pAVar7;
  pointer pEVar8;
  pointer pEVar9;
  long lVar10;
  pointer pdVar11;
  undefined1 auVar12 [16];
  double dVar13;
  bool bVar14;
  uint uVar15;
  uint64_t uVar16;
  ulong uVar17;
  ASTNode *pAVar18;
  ulong uVar19;
  pointer pFVar20;
  long lVar21;
  size_t i;
  color *pcVar22;
  int *piVar23;
  color *rel_func;
  undefined8 uVar24;
  Expr *this_02;
  pointer pFVar25;
  uint uVar26;
  size_t funcid;
  ulong uVar27;
  float fVar28;
  double dVar29;
  pointer paVar30;
  pointer paVar31;
  pointer extraout_XMM0_Qa;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined4 uVar40;
  float y;
  double __tmp;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  double dVar43;
  undefined8 in_XMM3_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80;
  double local_258;
  double local_238;
  double local_220;
  DrawBufferObject obj;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> line;
  color local_138;
  anon_enum_32 local_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  vector<double,_std::allocator<double>_> vals;
  double r;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&obj,"x",(allocator<char> *)&line);
  this_00 = &this->env;
  uVar16 = Environment::addr_of(this_00,(string *)&obj,false);
  this->x_var = (uint32_t)uVar16;
  std::__cxx11::string::~string((string *)&obj);
  std::__cxx11::string::string<std::allocator<char>>((string *)&obj,"y",(allocator<char> *)&line);
  uVar16 = Environment::addr_of(this_00,(string *)&obj,false);
  this->y_var = (uint32_t)uVar16;
  std::__cxx11::string::~string((string *)&obj);
  std::__cxx11::string::string<std::allocator<char>>((string *)&obj,"t",(allocator<char> *)&line);
  uVar16 = Environment::addr_of(this_00,(string *)&obj,false);
  this->t_var = (uint32_t)uVar16;
  std::__cxx11::string::~string((string *)&obj);
  dVar29 = view->xmin - view->xmax;
  dVar13 = view->ymin - view->ymax;
  bVar4 = this->loss_detail;
  this->loss_detail = false;
  pPVar6 = (this->pt_markers).
           super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    (this->pt_markers).
    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar6;
  }
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::reserve
            (&this->pt_markers,500);
  this_01 = &this->draw_buf;
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::clear(this_01)
  ;
  uVar27 = 0;
  while( true ) {
    rel_func = (color *)0x130;
    pFVar25 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar20 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar17 = ((long)pFVar20 - (long)pFVar25) / 0x130;
    if (uVar17 <= uVar27) break;
    if ((pFVar25[uVar27].type & 0xfffffff0U) == 0) {
      piVar23 = *(int **)&pFVar25[uVar27].expr.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl;
      lVar21 = ((long)*(pointer *)
                       ((long)&pFVar25[uVar27].expr.ast.
                               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       + 8) - (long)piVar23 >> 4) + 1;
      do {
        lVar21 = lVar21 + -1;
        if (lVar21 == 0) goto LAB_00137ac9;
        iVar5 = *piVar23;
        piVar23 = piVar23 + 4;
      } while (iVar5 != 0xc);
      if (uVar17 <= this->max_functions_find_crit_points) {
        uVar17 = (ulong)(&this->x_var)[(pFVar25[uVar27].type & 0xfffffff8U) == 8];
        Expr::diff((Expr *)&obj,&pFVar25[uVar27].expr,uVar17,this_00);
        pEVar1 = &pFVar25[uVar27].diff;
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
                  (&pEVar1->ast);
        std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       *)&obj);
        bVar14 = Expr::is_null(pEVar1);
        if (bVar14) {
          Expr::ASTNode::ASTNode((ASTNode *)&obj,null);
          pAVar7 = pFVar25[uVar27].ddiff.ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)pAVar7 =
               obj.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pAVar7->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               obj.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          Expr::diff((Expr *)&obj,pEVar1,uVar17,this_00);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_move_assign(&pFVar25[uVar27].ddiff.ast,&obj);
          std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         *)&obj);
        }
        Expr::diff((Expr *)&obj,&pFVar25[uVar27].recip,uVar17,this_00);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
                  (&pFVar25[uVar27].drecip.ast);
        std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       *)&obj);
      }
    }
LAB_00137ac9:
    uVar27 = uVar27 + 1;
  }
  for (pcVar22 = (color *)0x0; uVar24 = 0x130,
      pcVar22 < (color *)(((long)pFVar20 - (long)pFVar25) / 0x130);
      pcVar22 = (color *)((long)pcVar22->data + 1)) {
    if ((pFVar25[(long)pcVar22].type & 0xfffffff8U) == 0x80) {
      pEVar8 = *(pointer *)
                ((long)&pFVar25[(long)pcVar22].exprs.
                        super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl +
                8);
      pEVar9 = pFVar25[(long)pcVar22].exprs.
               super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
               super__Vector_impl_data._M_start;
      rel_func = (color *)0x18;
      if ((pEVar8 != pEVar9) && ((((long)pEVar8 - (long)pEVar9) / 0x18 & 1U) == 0)) {
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paVar31 = (pointer)0x0;
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar21 = 0;
        for (uVar27 = 0;
            lVar10 = *(long *)&pFVar25[(long)pcVar22].exprs.
                               super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                               _M_impl.super__Vector_impl_data,
            uVar27 < (ulong)(((long)*(pointer *)
                                     ((long)&pFVar25[(long)pcVar22].exprs.
                                             super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                             ._M_impl + 8) - lVar10) / 0x18); uVar27 = uVar27 + 2) {
          pEVar1 = (Expr *)(lVar21 + lVar10);
          obj.c.data[0] = -NAN;
          obj.c.data[1] = -NAN;
          obj.c.data[2] = -NAN;
          obj.c.data[3] = -NAN;
          bVar14 = Expr::is_ref(pEVar1);
          if (bVar14) {
            pAVar18 = Expr::operator[](pEVar1,0);
            obj.c.data._0_8_ = (pAVar18->field_1).ref;
            pdVar11 = (this_00->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (NAN(pdVar11[obj.c.data._0_8_])) {
              pdVar11[obj.c.data._0_8_] = 1.0;
            }
          }
          this_02 = (Expr *)(lVar10 + lVar21 + 0x18);
          bVar14 = Expr::is_ref(this_02);
          if (bVar14) {
            pAVar18 = Expr::operator[](this_02,0);
            obj.c.data._8_8_ = (pAVar18->field_1).ref;
            pdVar11 = (this_00->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (NAN(pdVar11[obj.c.data._8_8_])) {
              pdVar11[obj.c.data._8_8_] = 1.0;
            }
          }
          paVar30 = (pointer)Expr::operator()(pEVar1,this_00);
          paVar31 = (pointer)Expr::operator()(this_02,this_00);
          if ((ABS((double)paVar31) != INFINITY && ABS((double)paVar30) != INFINITY) &&
              (!NAN((double)paVar30) && !NAN((double)paVar31))) {
            vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)paVar30;
            vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)paVar31;
            std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
            emplace_back<std::array<double,2ul>>
                      ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                       &line,(array<double,_2UL> *)&vals);
            obj.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)obj.points.
                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffff00000000);
            obj.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = paVar31;
            obj.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = paVar30;
            obj.c.r._0_1_ = 0;
            obj._24_8_ = pcVar22;
            std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
            emplace_back<nivalis::PointMarker>(&this->pt_markers,(PointMarker *)&obj);
            paVar31 = extraout_XMM0_Qa;
          }
          lVar21 = lVar21 + 0x30;
        }
        uVar26 = pFVar25[(long)pcVar22].type;
        rel_func = (color *)(ulong)(uVar26 & 1);
        in_stack_fffffffffffffd78 = (uVar26 & 2) >> 1;
        anon_unknown_1::buf_add_polyline
                  (this_01,(View *)&line,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &pFVar25[(long)pcVar22].line_color,pcVar22,(size_t)rel_func,SUB84(paVar31,0),
                   (uVar26 & 4) == 0,SUB41(in_stack_fffffffffffffd78,0),
                   (bool)in_stack_fffffffffffffd80);
        std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       *)&line);
        pFVar25 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar20 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
  }
  pcVar22 = (color *)0x0;
  do {
    if ((color *)(((long)pFVar20 - (long)pFVar25) / 0x130) <= pcVar22) {
      if (this->loss_detail == false) {
        if (bVar4 != false) {
          (this->func_error)._M_string_length = 0;
          *(this->func_error)._M_dataplus._M_p = '\0';
        }
      }
      else {
        std::__cxx11::string::assign((char *)&this->func_error);
      }
      return;
    }
    switch((uint)pFVar25[(long)pcVar22].type >> 3) {
    case 0:
      bVar14 = false;
      goto LAB_0013817a;
    case 1:
      bVar14 = true;
LAB_0013817a:
      plot_explicit(this,(size_t)pcVar22,bVar14);
      break;
    case 2:
      plot_implicit(this,(size_t)pcVar22);
      break;
    case 3:
      line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_220 = (double)pFVar25[(long)pcVar22].tmin;
      dVar32 = (double)pFVar25[(long)pcVar22].tmax;
      local_238 = dVar32;
      if (pFVar25[(long)pcVar22].tmin <= pFVar25[(long)pcVar22].tmax) {
        local_238 = local_220;
        local_220 = dVar32;
      }
      uVar26 = pFVar25[(long)pcVar22].type;
      if ((uVar26 & 1) != 0) {
        dVar32 = (local_220 - local_238) / 0.0031415926535897933 + 1.0;
        uVar27 = (ulong)dVar32;
        std::vector<double,_std::allocator<double>_>::reserve
                  (&vals,(long)(dVar32 - 9.223372036854776e+18) & (long)uVar27 >> 0x3f | uVar27);
      }
      if ((uVar26 & 2) == 0) {
        dVar32 = (local_220 - local_238) / 0.0031415926535897933 + 1.0;
        uVar27 = (ulong)dVar32;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
                  (&line,(long)(dVar32 - 9.223372036854776e+18) & (long)uVar27 >> 0x3f | uVar27);
      }
      for (dVar32 = local_238; dVar32 <= local_220; dVar32 = dVar32 + 0.0031415926535897933) {
        (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[this->t_var] = dVar32;
        r = Expr::operator()(&pFVar25[(long)pcVar22].expr,this_00);
        if ((uVar26 & 1) != 0) {
          std::vector<double,_std::allocator<double>_>::push_back(&vals,&r);
        }
        dVar33 = r;
        if ((uVar26 & 2) == 0) {
          dVar35 = cos(dVar32);
          dVar34 = r;
          dVar43 = sin(dVar32);
          obj.points.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(dVar43 * dVar34,0);
          obj.points.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)(dVar35 * dVar33);
          obj.points.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)(dVar43 * dVar34) >> 0x20);
          std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
          emplace_back<std::array<double,2ul>>
                    ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&line,
                     (array<double,_2UL> *)&obj);
        }
      }
      if ((uVar26 & 2) == 0) {
        in_stack_fffffffffffffd78 = 0;
        rel_func = (color *)0x0;
        uVar24 = 1;
        anon_unknown_1::buf_add_polyline
                  (this_01,(View *)&line,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &pFVar25[(long)pcVar22].line_color,pcVar22,0,SUB84(local_220,0),true,false,
                   (bool)in_stack_fffffffffffffd80);
      }
      if ((uVar26 & 1) != 0) {
        dVar32 = fmod(local_238,6.283185307179586);
        dVar33 = fmod(local_220,6.283185307179586);
        in_XMM3_Qb = 0;
        dVar33 = (double)(~-(ulong)(dVar33 < 0.0) & (ulong)dVar33 |
                         (ulong)(dVar33 + 6.283185307179586) & -(ulong)(dVar33 < 0.0));
        local_c0 = local_238 -
                   (double)(~-(ulong)(dVar32 < 0.0) & (ulong)dVar32 |
                           (ulong)(dVar32 + 6.283185307179586) & -(ulong)(dVar32 < 0.0));
        y = 0.0;
        while( true ) {
          fVar28 = (float)view->shigh;
          if (fVar28 <= y) break;
          local_b0 = ((view->ymax - view->ymin) * (double)(fVar28 - y)) / (double)view->shigh +
                     view->ymin;
          local_b8 = local_b0 * local_b0;
          for (fVar28 = 0.0; fVar28 < (float)view->swid; fVar28 = fVar28 + 1.5) {
            dVar32 = ((view->xmax - view->xmin) * (double)fVar28) / (double)view->swid + view->xmin;
            dVar34 = atan2(local_b0,dVar32);
            pdVar11 = vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar32 = dVar32 * dVar32 + local_b8;
            in_XMM3_Qb = 0;
            local_258 = 0.0;
            auVar44._0_8_ = ~-(ulong)(dVar34 < 0.0) & (ulong)dVar34;
            auVar44._8_8_ = 0;
            auVar12._8_4_ = (int)extraout_XMM0_Qb;
            auVar12._0_8_ = (ulong)(dVar34 + 6.283185307179586) & -(ulong)(dVar34 < 0.0);
            auVar12._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
            auVar44 = auVar44 | auVar12;
            uVar27 = ((long)vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) - 1;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = local_c0;
            while (auVar42._0_8_ <=
                   (double)(~-(ulong)(dVar33 == 0.0) & (ulong)(6.283185307179586 - dVar33)) +
                   local_220 + local_220) {
              dVar35 = auVar44._0_8_ + auVar42._0_8_;
              dVar34 = local_258;
              if ((local_238 <= dVar35) && (dVar35 <= local_220)) {
                dVar34 = round((dVar35 - local_238) / 0.0031415926535897933);
                uVar40 = 0;
                uVar41 = 0;
                if (0.0 <= dVar34) {
                  uVar40 = SUB84(dVar34,0);
                  uVar41 = (undefined4)((ulong)dVar34 >> 0x20);
                }
                uVar19 = (long)((double)CONCAT44(uVar41,uVar40) - 9.223372036854776e+18) &
                         (long)(double)CONCAT44(uVar41,uVar40) >> 0x3f |
                         (long)(double)CONCAT44(uVar41,uVar40);
                uVar17 = uVar27;
                if (uVar19 <= uVar27) {
                  uVar17 = uVar19;
                }
                auVar42._8_8_ = 0;
                dVar34 = local_258 * 0.75 + 0.25;
                if (((uVar26 & 4) == 0) == SQRT(dVar32) < pdVar11[uVar17]) {
                  dVar34 = local_258;
                }
              }
              local_258 = dVar34;
              auVar42._0_8_ = auVar42._0_8_ + 6.283185307179586;
            }
            if (0.0 < local_258) {
              color::color::color((color *)&obj,&pFVar25[(long)pcVar22].line_color);
              *(float *)obj.c.data._8_8_ = (float)local_258;
              in_XMM3_Qb = 0;
              anon_unknown_1::buf_add_screen_rectangle
                        (this_01,view,fVar28,y,1.5,1.5,SUB81(&obj,0),pcVar22,auVar44._0_4_,
                         (size_t)rel_func);
            }
          }
          y = y + 1.5;
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&vals);
      std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base(&line.
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   );
    default:
      goto switchD_00137dd2_caseD_4;
    case 5:
      if ((long)*(pointer *)
                 ((long)&pFVar25[(long)pcVar22].exprs.
                         super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl +
                 8) -
          *(long *)&pFVar25[(long)pcVar22].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data != 0x30) goto switchD_00137dd2_caseD_4;
      obj.points.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      obj.points.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._0_16_ = ZEXT816(0);
      dVar33 = (double)pFVar25[(long)pcVar22].tmin;
      dVar32 = (double)pFVar25[(long)pcVar22].tmax;
      if (pFVar25[(long)pcVar22].tmax < pFVar25[(long)pcVar22].tmin) {
        auVar39._8_4_ = (int)in_XMM3_Qb;
        auVar39._0_8_ = dVar33;
        auVar39._12_4_ = (int)((ulong)in_XMM3_Qb >> 0x20);
        in_XMM3_Qb = 0;
      }
      else {
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar32;
        dVar32 = dVar33;
      }
      dVar34 = auVar39._0_8_;
      dVar35 = (dVar34 - dVar32) / 10000.0;
      dVar33 = 1e-12;
      if (1e-12 <= dVar35) {
        dVar33 = dVar35;
      }
      for (dVar43 = dVar32; dVar43 <= auVar39._0_8_; dVar43 = dVar43 + dVar33) {
        (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[this->t_var] = dVar43;
        dVar35 = Expr::operator()(pFVar25[(long)pcVar22].exprs.
                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                  _M_impl.super__Vector_impl_data._M_start,this_00);
        dVar36 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                          
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18),this_00);
        if ((dVar32 < dVar43) &&
           (dVar37 = (dVar35 - local_d0) * (dVar35 - local_d0) +
                     (dVar36 - local_c8) * (dVar36 - local_c8),
           SQRT(dVar29 * dVar29 + dVar13 * dVar13) * 0.01 < dVar37)) {
          anon_unknown_1::buf_add_screen_polyline
                    (this_01,view,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &obj,&pFVar25[(long)pcVar22].line_color,(size_t)pcVar22,SUB84(dVar37,0),
                     SUB81(uVar24,0),SUB41(in_stack_fffffffffffffd78,0),
                     (bool)in_stack_fffffffffffffd80);
          if (obj.points.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              obj.points.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            obj.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 obj.points.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        uVar2 = view->swid;
        uVar3 = view->shigh;
        auVar38._0_8_ = (double)(int)uVar2 * (dVar35 - view->xmin);
        auVar38._8_8_ = (double)(int)uVar3 * (view->ymax - dVar36);
        auVar45._0_8_ = view->xmax - view->xmin;
        auVar45._8_8_ = view->ymax - view->ymin;
        auVar39 = divpd(auVar38,auVar45);
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44((float)auVar39._8_8_,(float)auVar39._0_8_);
        std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
        emplace_back<std::array<float,2ul>>
                  ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)&obj,
                   (array<float,_2UL> *)&line);
        in_XMM3_Qb = 0;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar34;
        local_d0 = dVar35;
        local_c8 = dVar36;
      }
      rel_func = pcVar22;
      anon_unknown_1::buf_add_screen_polyline
                (this_01,view,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&obj,
                 &pFVar25[(long)pcVar22].line_color,(size_t)pcVar22,SUB84(dVar35,0),SUB81(uVar24,0),
                 SUB41(in_stack_fffffffffffffd78,0),(bool)in_stack_fffffffffffffd80);
      std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&obj);
      break;
    case 0x11:
      if ((long)*(pointer *)
                 ((long)&pFVar25[(long)pcVar22].exprs.
                         super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl +
                 8) -
          *(long *)&pFVar25[(long)pcVar22].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data != 0x60) goto switchD_00137dd2_caseD_4;
      DrawBufferObject::DrawBufferObject(&obj);
      obj.rel_func = (size_t)pcVar22;
      color::color::operator=((color *)&line,&obj.c,&pFVar25[(long)pcVar22].line_color);
      obj.thickness = 2.0;
      obj.type = RECT;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                (&obj.points,2);
      paVar31 = obj.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar32 = Expr::operator()(pFVar25[(long)pcVar22].exprs.
                                super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                _M_impl.super__Vector_impl_data._M_start,this_00);
      paVar31->_M_elems[0] = dVar32;
      dVar32 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                      
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18),this_00);
      paVar31->_M_elems[1] = dVar32;
      dVar32 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                      
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x30),this_00);
      paVar31[1]._M_elems[0] = dVar32;
      dVar33 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                      
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x48),this_00);
      paVar31[1]._M_elems[1] = dVar33;
      dVar32 = paVar31->_M_elems[0];
      if (paVar31[1]._M_elems[0] < dVar32) {
        paVar31->_M_elems[0] = paVar31[1]._M_elems[0];
        paVar31[1]._M_elems[0] = dVar32;
      }
      dVar32 = paVar31->_M_elems[1];
      if (dVar33 < dVar32) {
        paVar31->_M_elems[1] = dVar33;
        paVar31[1]._M_elems[1] = dVar32;
      }
      uVar26 = pFVar25[(long)pcVar22].type;
      if ((uVar26 & 2) != 0) {
        DrawBufferObject::DrawBufferObject((DrawBufferObject *)&line,&obj);
        local_e0 = FILLED_RECT;
        anon_unknown_1::get_ineq_color((color *)&vals,&pFVar25[(long)pcVar22].line_color);
        color::color::operator=((color *)&r,&local_138,(color *)&vals);
        std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
        emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)&line);
        DrawBufferObject::~DrawBufferObject((DrawBufferObject *)&line);
        uVar26 = pFVar25[(long)pcVar22].type;
      }
      if ((uVar26 & 4) == 0) {
        std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
        emplace_back<nivalis::DrawBufferObject>(this_01,&obj);
      }
LAB_001382b5:
      DrawBufferObject::~DrawBufferObject(&obj);
      break;
    case 0x12:
    case 0x13:
      uVar26 = pFVar25[(long)pcVar22].type & 0xfffffff8;
      if (((long)*(pointer *)
                  ((long)&pFVar25[(long)pcVar22].exprs.
                          super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl
                  + 8) -
          *(long *)&pFVar25[(long)pcVar22].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data) / 0x18 == (ulong)(uVar26 == 0x98) + 3) {
        DrawBufferObject::DrawBufferObject(&obj);
        obj.rel_func = (size_t)pcVar22;
        color::color::operator=((color *)&line,&obj.c,&pFVar25[(long)pcVar22].line_color);
        obj.thickness = 2.0;
        obj.type = (uVar26 == 0x98) + 7 + (uint)(uVar26 == 0x98);
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                  (&obj.points,2);
        paVar31 = obj.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar32 = Expr::operator()(pFVar25[(long)pcVar22].exprs.
                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                  _M_impl.super__Vector_impl_data._M_start,this_00);
        paVar31->_M_elems[0] = dVar32;
        dVar32 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                          
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18),this_00);
        paVar31->_M_elems[1] = dVar32;
        dVar32 = paVar31->_M_elems[0];
        dVar33 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                          
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x30),this_00);
        paVar31[1]._M_elems[0] = dVar32 + dVar33;
        paVar31[1]._M_elems[1] = paVar31->_M_elems[1];
        if (uVar26 == 0x98) {
          dVar32 = Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                              
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x48),this_00);
          paVar31[1]._M_elems[1] = dVar32 + paVar31[1]._M_elems[1];
        }
        uVar15 = pFVar25[(long)pcVar22].type;
        if ((uVar15 & 2) != 0) {
          DrawBufferObject::DrawBufferObject((DrawBufferObject *)&line,&obj);
          local_e0 = (uVar26 == 0x98) + 8 + (uint)(uVar26 == 0x98);
          anon_unknown_1::get_ineq_color((color *)&vals,&pFVar25[(long)pcVar22].line_color);
          color::color::operator=((color *)&r,&local_138,(color *)&vals);
          std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
          emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)&line);
          DrawBufferObject::~DrawBufferObject((DrawBufferObject *)&line);
          uVar15 = pFVar25[(long)pcVar22].type;
        }
        if ((uVar15 & 4) == 0) {
          std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
          emplace_back<nivalis::DrawBufferObject>(this_01,&obj);
        }
        DrawBufferObject::~DrawBufferObject(&obj);
      }
      goto switchD_00137dd2_caseD_4;
    case 0x14:
      if ((long)*(pointer *)
                 ((long)&pFVar25[(long)pcVar22].exprs.
                         super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl +
                 8) -
          *(long *)&pFVar25[(long)pcVar22].exprs.
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data == 0x30) {
        DrawBufferObject::DrawBufferObject(&obj);
        obj.rel_func = (size_t)pcVar22;
        color::color::operator=((color *)&line,&obj.c,&pFVar25[(long)pcVar22].line_color);
        obj.type = TEXT;
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)Expr::operator()(pFVar25[(long)pcVar22].exprs.
                                       super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                       ._M_impl.super__Vector_impl_data._M_start,this_00);
        line.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)Expr::operator()((Expr *)(*(long *)&pFVar25[(long)pcVar22].exprs.
                                                                                                                    
                                                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18),this_00);
        std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_assign_aux<std::array<double,2ul>const*>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&obj,
                   (color *)&line,
                   &line.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::_M_assign((string *)&obj.str);
        std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
        emplace_back<nivalis::DrawBufferObject>(this_01,&obj);
        goto LAB_001382b5;
      }
switchD_00137dd2_caseD_4:
    }
    pcVar22 = (color *)((long)pcVar22->data + 1);
    pFVar25 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar20 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void Plotter::render(const View& view) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    // * Constants
    // Number of different t values to evaluate for a parametric equation
    static const double PARAMETRIC_STEPS = 1e4;
    // Number of different t values to evaluate for a polar function
    static const double POLAR_STEP_SIZE = M_PI * 1e-3;
    // If parametric function moves more than this amount (square of l2),
    // disconnects the function line
    const double PARAMETRIC_DISCONN_THRESH = 1e-2 *
        std::sqrt(util::sqr_dist(view.xmin, view.ymin, view.xmax, view.ymax));

    bool prev_loss_detail = loss_detail;
    loss_detail = false; // Will set to show 'some detail may be lost'

    // * Clear back buffers
    pt_markers.clear(); pt_markers.reserve(500);
    draw_buf.clear();

    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            bool has_call = false;
            for (size_t i = 0 ; i < funcs[funcid].expr.ast.size(); ++i) {
                if (funcs[funcid].expr.ast[i].opcode == OpCode::call) {
                    has_call = true;
                    break;
                }
            }
            if (has_call && funcs.size() <= max_functions_find_crit_points) {
                // Re-compute derivatives, if explicit and has
                // at least one user-function call
                // This is needed since the user function may have been changed
                if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                        ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
                    uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
                    func.diff = func.expr.diff(var, env);
                    if (!func.diff.is_null()) {
                        func.ddiff = func.diff.diff(var, env);
                    }
                    else func.ddiff.ast[0] = OpCode::null;
                    func.drecip = func.recip.diff(var, env);
                }
            }
        }
    }

    // * Draw functions
    // BEGIN_PROFILE;
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        if ((func.type & ~Function::FUNC_TYPE_MOD_ALL) ==
                Function::FUNC_TYPE_GEOM_POLYLINE) {
            // Draw polyline
            // Do this first since it can affect other functions in the same frame
            // e.g (p, q) moved
            if (func.exprs.size() && (func.exprs.size() & 1) == 0) {
                std::vector<std::array<double, 2> > line;
                double mark_radius = MARKER_DISP_RADIUS - 1;
                for (size_t i = 0; i < func.exprs.size(); i += 2) {
                    PointMarker ptm;
                    auto& expr_x = func.exprs[i],
                    & expr_y = func.exprs[i+1];
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    if (expr_x.is_ref()) {
                        ptm.drag_var_x = expr_x[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_x])) {
                            env.vars[ptm.drag_var_x] = 1.;
                        }
                    }
                    if (expr_y.is_ref()) {
                        ptm.drag_var_y = expr_y[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_y])) {
                            env.vars[ptm.drag_var_y] = 1.;
                        }
                    }
                    double x = expr_x(env), y = expr_y(env);
                    if (std::isnan(x) || std::isnan(y) ||
                            std::isinf(x) || std::isinf(y)) {
                        continue;
                    }
                    line.push_back({x, y});
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.y = y; ptm.x = x;
                    ptm.passive = false;
                    ptm.rel_func = funcid;
                    pt_markers.push_back(std::move(ptm));
                }
                buf_add_polyline(draw_buf, view, line, func.line_color,
                        funcid, 2.f,
                        func.type & Function::FUNC_TYPE_MOD_CLOSED,
                        (func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0,
                        func.type & Function::FUNC_TYPE_MOD_FILLED);
            }
        }
    }
    // Draw all other functions
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        switch (ftype_nomod) {
            case Function::FUNC_TYPE_IMPLICIT:
                plot_implicit(funcid); break;
            case Function::FUNC_TYPE_PARAMETRIC:
                {
                    if (func.exprs.size() != 2) continue;
                    std::vector<std::array<float, 2> > curr_line;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    double tstep = std::max((tmax - tmin) / PARAMETRIC_STEPS, 1e-12);
                    double px, py;
                    for (double t = tmin; t <= tmax; t += tstep) {
                        env.vars[t_var] = t;
                        double x = func.exprs[0](env),
                               y = func.exprs[1](env);
                        if (t > tmin && util::sqr_dist(x, y, px, py) > PARAMETRIC_DISCONN_THRESH) {
                            buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                            curr_line.clear();
                        }
                        float sx = _X_TO_SX(x), sy = _Y_TO_SY(y);
                        curr_line.push_back({sx, sy});
                        px = x; py = y;
                    }
                    buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                }
                break;
            case Function::FUNC_TYPE_POLAR:
                {
                    std::vector<std::array<double, 2> > curr_line;
                    std::vector<double> vals;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    bool has_line = ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0);
                    bool is_ineq = (func.type & Function::FUNC_TYPE_MOD_INEQ) != 0;
                    bool is_ineq_less = (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) != 0;
                    if (is_ineq) {
                        vals.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    if (has_line) {
                        curr_line.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    for (double t = tmin; t <= tmax; t += POLAR_STEP_SIZE) {
                        env.vars[t_var] = t;
                        double r = func.expr(env);
                        if (is_ineq) vals.push_back(r);
                        if (has_line) {
                            double x = r * cos(t), y = r * sin(t);
                            curr_line.push_back({x, y});
                        }
                    }
                    if (has_line) {
                        buf_add_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f,
                                false, true, false);
                    }
                    if (is_ineq) {
                        const float INTERVAL = 1.5f;
                        double beg_mod = std::fmod(tmin, 2*M_PI);
                        double end_mod = std::fmod(tmax, 2*M_PI);
                        if (beg_mod < 0) beg_mod += 2 * M_PI;
                        if (end_mod < 0) end_mod += 2 * M_PI;
                        double t_start = tmin - beg_mod;
                        double t_end = tmax + (end_mod == 0.0 ? 0.0 : (2*M_PI - end_mod));
                        for (float sy = 0; sy < view.shigh; sy += INTERVAL) {
                            double y = _SY_TO_Y(sy);
                            for (float sx = 0; sx < view.swid; sx += INTERVAL) {
                                double x = _SX_TO_X(sx);
                                double theta_mod = std::atan2(y, x);
                                double r = std::sqrt(x*x + y*y);
                                if (theta_mod < 0) theta_mod += 2 * M_PI;
                                double alpha = 0.;
                                for (double t = t_start; t <= tmax + t_end; t += 2*M_PI) {
                                    double theta = t + theta_mod;
                                    if (theta < tmin || theta > tmax) continue;
                                    size_t near_idx = std::min((size_t)std::max(
                                                std::round((theta - tmin) / POLAR_STEP_SIZE), 0.),
                                                vals.size() - 1);
                                    double thresh_r = vals[near_idx];
                                    if (r < thresh_r == is_ineq_less) {
                                        alpha = 0.25 + 0.75 * alpha; // Simulate blend
                                    }
                                }
                                if (alpha > 0.) {
                                    color::color c = func.line_color;
                                    c.a = alpha;
                                    buf_add_screen_rectangle(draw_buf, view, sx, sy,
                                            INTERVAL, INTERVAL, true, c, 0.0f, funcid);
                                }
                            }
                        }
                    }
                }
                break;
            case Function::FUNC_TYPE_EXPLICIT:
                plot_explicit(funcid, false); break;
            case Function::FUNC_TYPE_EXPLICIT_Y:
                plot_explicit(funcid, true); break;

            // Geometry (other than polyline)
            case Function::FUNC_TYPE_GEOM_RECT:
                {
                    if (func.exprs.size() != 4) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = DrawBufferObject::RECT;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &b = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    b[0] = func.exprs[2](env);
                    b[1] = func.exprs[3](env);
                    if (b[0] < a[0]) std::swap(a[0], b[0]);
                    if (b[1] < a[1]) std::swap(a[1], b[1]);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = DrawBufferObject::FILLED_RECT;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_CIRCLE:
            case Function::FUNC_TYPE_GEOM_ELLIPSE:
                {
                    size_t is_ellipse = (ftype_nomod == Function::FUNC_TYPE_GEOM_ELLIPSE);
                    if (func.exprs.size() != 3 + is_ellipse) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = is_ellipse ? DrawBufferObject::ELLIPSE : DrawBufferObject::CIRCLE;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &right = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    right[0] = a[0] + func.exprs[2](env);
                    right[1] = a[1];
                    if (is_ellipse) right[1] += func.exprs[3](env);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = is_ellipse ? DrawBufferObject::FILLED_ELLIPSE :
                            DrawBufferObject::FILLED_CIRCLE;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_TEXT:
                {
                    if (func.exprs.size() != 2) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.type = DrawBufferObject::TEXT;
                    obj.points = { { func.exprs[0](env), func.exprs[1](env) } };
                    obj.str = func.str;
                    draw_buf.push_back(std::move(obj));
                }
                break;
            case Function::FUNC_TYPE_FRACTAL_MANDELBROT:
                {
                }
                break;
        }
    }
    // PROFILE(all);
    if (loss_detail) {
        func_error = "Warning: some detail may be lost";
    } else if (prev_loss_detail) {
        func_error.clear();
    }
}